

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O2

void container_checked_add(container_t *container,uint16_t val,uint8_t typecode)

{
  ulong uVar1;
  int iVar2;
  array_container_t *arr;
  undefined7 in_register_00000011;
  ulong uVar3;
  unsigned_long uStack_40;
  uint8_t local_29;
  
  arr = (array_container_t *)container;
  local_29 = typecode;
  if ((int)CONCAT71(in_register_00000011,typecode) == 4) {
    arr = (array_container_t *)
          shared_container_extract_copy((shared_container_t *)container,&local_29);
  }
  if (local_29 == '\x03') {
    run_container_add((run_container_t *)arr,val);
    uStack_40 = 3;
  }
  else {
    if (local_29 == '\x02') {
      iVar2 = array_container_try_add(arr,val,0x1000);
      if (iVar2 != -1) {
        uStack_40 = 2;
        goto LAB_00102879;
      }
      arr = (array_container_t *)bitset_container_from_array(arr);
      bitset_container_add((bitset_container_t *)arr,val);
    }
    else {
      uVar1 = *(ulong *)(arr->array + (ulong)(val >> 6) * 4);
      uVar3 = uVar1 | 1L << ((ulong)val & 0x3f);
      arr->cardinality = arr->cardinality + (int)((uVar1 ^ uVar3) >> ((byte)val & 0x3f));
      *(ulong *)(arr->array + (ulong)(val >> 6) * 4) = uVar3;
    }
    uStack_40 = 1;
  }
LAB_00102879:
  _assert_int_equal((ulong)typecode,uStack_40,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                    ,0x1d);
  _assert_true((ulong)(arr == (array_container_t *)container),"container == new_container",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x1e);
  return;
}

Assistant:

static inline void container_checked_add(container_t *container, uint16_t val,
                                         uint8_t typecode) {
    uint8_t new_type;
    container_t *new_container =
        container_add(container, val, typecode, &new_type);
    assert_int_equal(typecode, new_type);
    assert_true(container == new_container);
}